

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

ON_wString __thiscall
ON_FileSystemPath::CombinePaths
          (ON_FileSystemPath *this,wchar_t *left_side,bool bLeftSideContainsFileName,
          wchar_t *right_side,bool bRightSideContainsFileName,bool bAppendTrailingDirectorySeparator
          )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  wchar_t *pwVar4;
  undefined7 in_register_00000011;
  ON_wString tmp;
  ON_wString rhs;
  ON_wString lhs;
  ON_wString rhs_fname;
  ON_wString rhs_volume;
  ON_wString lhs_fname;
  wchar_t *dir;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString local_40;
  wchar_t *local_38;
  
  ON_wString::ON_wString(&local_40);
  if ((int)CONCAT71(in_register_00000011,bLeftSideContainsFileName) == 0) {
    CleanPath((ON_FileSystemPath *)&local_58,left_side);
  }
  else {
    RemoveFileName((ON_FileSystemPath *)&local_58,left_side,&local_40);
  }
  ON_wString::ON_wString(&local_50);
  if (bRightSideContainsFileName) {
    RemoveFileName((ON_FileSystemPath *)&local_60,right_side,&local_50);
  }
  else {
    CleanPath((ON_FileSystemPath *)&local_60,right_side);
  }
  ON_wString::ON_wString(&local_48);
  bVar1 = ON_wString::IsNotEmpty(&local_58);
  if (bVar1) {
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_60);
    RemoveVolumeName((ON_FileSystemPath *)&local_68,pwVar4,&local_48);
    ON_wString::operator=(&local_60,&local_68);
    ON_wString::~ON_wString(&local_68);
  }
  bVar1 = ON_wString::IsNotEmpty(&local_60);
  if (bVar1) {
    pwVar4 = ON_wString::operator[](&local_60,0);
    if ((*pwVar4 == L'/') || (*pwVar4 == L'\\')) {
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_60);
      ON_wString::ON_wString(&local_68,pwVar4 + 1);
      ON_wString::operator=(&local_60,&local_68);
      ON_wString::~ON_wString(&local_68);
    }
  }
  ON_wString::ON_wString((ON_wString *)this,&local_58);
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
  if (bVar1) {
    iVar3 = ON_wString::Length((ON_wString *)this);
    pwVar4 = ON_wString::operator[]((ON_wString *)this,iVar3 + -1);
    bVar1 = true;
    if (*pwVar4 != L'/') {
      bVar1 = *pwVar4 == L'\\';
    }
  }
  else {
    bVar1 = false;
  }
  bVar2 = ON_wString::IsNotEmpty(&local_60);
  if (bVar2) {
    bVar2 = ON_wString::IsNotEmpty((ON_wString *)this);
    if (bVar1 == false && bVar2) {
      ON_wString::operator+=((ON_wString *)this,L'/');
    }
    ON_wString::operator+=((ON_wString *)this,&local_60);
    bVar1 = ON_wString::IsNotEmpty(&local_58);
    if (bVar1) {
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&local_60);
      bVar1 = IsRelativePath(pwVar4);
      if (bVar1) {
        pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
        CleanPath((ON_FileSystemPath *)&local_68,pwVar4);
        ON_wString::operator=((ON_wString *)this,&local_68);
        ON_wString::~ON_wString(&local_68);
      }
    }
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
    if (bVar1) {
      iVar3 = ON_wString::Length((ON_wString *)this);
      pwVar4 = ON_wString::operator[]((ON_wString *)this,iVar3 + -1);
      bVar1 = true;
      if (*pwVar4 != L'/') {
        bVar1 = *pwVar4 == L'\\';
      }
    }
    else {
      bVar1 = false;
    }
  }
  bVar2 = ON_wString::IsNotEmpty((ON_wString *)this);
  if (bVar2) {
    bVar2 = ON_wString::IsNotEmpty(&local_50);
    bAppendTrailingDirectorySeparator = bVar2 || bAppendTrailingDirectorySeparator;
  }
  if (bVar1 != bAppendTrailingDirectorySeparator) {
    if (bAppendTrailingDirectorySeparator == false) {
      if (bVar1 != false) {
        iVar3 = ON_wString::Length((ON_wString *)this);
        ON_wString::SetLength((ON_wString *)this,(long)(iVar3 + -1));
      }
    }
    else {
      local_68.m_s = (wchar_t *)0x0;
      local_38 = (wchar_t *)0x0;
      pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
      on_wsplitpath(pwVar4,&local_68.m_s,&local_38,(wchar_t **)0x0,(wchar_t **)0x0);
      if (local_38 != (wchar_t *)0x0) {
        iVar3 = ON_wString::Length((ON_wString *)this);
        pwVar4 = ON_wString::operator[]((ON_wString *)this,iVar3 + -1);
        if ((*pwVar4 != L'/') && (*pwVar4 != L'\\')) {
          ON_wString::operator+=((ON_wString *)this,L'/');
        }
      }
    }
  }
  ON_wString::operator+=((ON_wString *)this,&local_50);
  ON_wString::~ON_wString(&local_48);
  ON_wString::~ON_wString(&local_60);
  ON_wString::~ON_wString(&local_50);
  ON_wString::~ON_wString(&local_58);
  ON_wString::~ON_wString(&local_40);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::CombinePaths(
  const wchar_t* left_side,
  bool bLeftSideContainsFileName,
  const wchar_t* right_side,
  bool bRightSideContainsFileName,
  bool bAppendTrailingDirectorySeparator
)
{
  ON_wString lhs_fname;
  ON_wString lhs
    = bLeftSideContainsFileName
    ? ON_FileSystemPath::RemoveFileName(left_side,&lhs_fname)
    : ON_FileSystemPath::CleanPath(left_side);

  ON_wString rhs_fname;
  ON_wString rhs 
    = bRightSideContainsFileName
    ? ON_FileSystemPath::RemoveFileName(right_side,&rhs_fname)
    : ON_FileSystemPath::CleanPath(right_side);

  ON_wString rhs_volume;
  if ( lhs.IsNotEmpty() )
    rhs = ON_FileSystemPath::RemoveVolumeName(rhs, &rhs_volume);

  if (rhs.IsNotEmpty() && ON_FileSystemPath::IsDirectorySeparator(rhs[0], true))
  {
    const ON_wString tmp(static_cast<const wchar_t*>(rhs) + 1);
    rhs = tmp;
  }

  ON_wString path = lhs;
  bool bPathEndsDirectorySeparator 
    = path.IsNotEmpty()
    && ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true);
  
  if (rhs.IsNotEmpty())
  {
    if (path.IsNotEmpty() && false == bPathEndsDirectorySeparator)
      path += ON_FileSystemPath::DirectorySeparator;
    path += rhs;

    if (lhs.IsNotEmpty() && ON_FileSystemPath::IsRelativePath(rhs))
      path = ON_FileSystemPath::CleanPath(path);

    bPathEndsDirectorySeparator 
      = path.IsNotEmpty()
      && ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true);
  }

  if (path.IsNotEmpty() && rhs_fname.IsNotEmpty())
    bAppendTrailingDirectorySeparator = true;

  if ((bPathEndsDirectorySeparator ? 0 : 1) != (bAppendTrailingDirectorySeparator ? 0 : 1))
  {
    if (bAppendTrailingDirectorySeparator)
    {
      const wchar_t* vol = nullptr;
      const wchar_t* dir = nullptr;
      // on_wsplitpath is called to avoid appending a directory separator to a 
      on_wsplitpath(static_cast<const wchar_t*>(path), &vol, &dir, nullptr, nullptr);
      if (nullptr != dir && false == ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true))
        path += ON_FileSystemPath::DirectorySeparator;
    }
    else if ( bPathEndsDirectorySeparator )
    {
      path.SetLength(path.Length() - 1);
    }
  }

  path += rhs_fname;

  return path;
}